

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O2

longlong __thiscall SchemePair::list_length(SchemePair *this)

{
  size_type sVar1;
  longlong ans;
  initializer_list<const_SchemePair_*> __l;
  longlong lStack_90;
  allocator_type local_7a;
  less<const_SchemePair_*> local_79;
  SchemePair *p;
  shared_ptr<SchemeObject> local_70;
  set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
  visited;
  
  __l._M_len = 1;
  __l._M_array = (iterator)&local_70;
  p = this;
  local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_SchemeObject;
  std::set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>::
  set(&visited,__l,&local_79,&local_7a);
  lStack_90 = 0;
  do {
    if (this == (SchemePair *)0x0) {
      lStack_90 = -1;
LAB_00121971:
      std::
      _Rb_tree<const_SchemePair_*,_const_SchemePair_*,_std::_Identity<const_SchemePair_*>,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
      ::~_Rb_tree(&visited._M_t);
      return lStack_90;
    }
    if (this == (SchemePair *)
                scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    goto LAB_00121971;
    std::dynamic_pointer_cast<SchemePair,SchemeObject>(&local_70);
    p = (SchemePair *)local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_70.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    sVar1 = std::
            set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
            ::count(&visited,&p);
    if (sVar1 != 0) {
      lStack_90 = -2;
      goto LAB_00121971;
    }
    std::
    _Rb_tree<SchemePair_const*,SchemePair_const*,std::_Identity<SchemePair_const*>,std::less<SchemePair_const*>,std::allocator<SchemePair_const*>>
    ::_M_insert_unique<SchemePair_const*const&>
              ((_Rb_tree<SchemePair_const*,SchemePair_const*,std::_Identity<SchemePair_const*>,std::less<SchemePair_const*>,std::allocator<SchemePair_const*>>
                *)&visited,&p);
    lStack_90 = lStack_90 + 1;
    this = p;
  } while( true );
}

Assistant:

long long SchemePair::list_length() const
{
    const SchemePair *p = this;
    std::set<const SchemePair*> visited{p};
    for(long long ans=0;;++ans)
    {
        if(!p)
            return -1;
        if(p == scheme_nil.get())
            return ans;
        p = std::dynamic_pointer_cast<SchemePair>(p->cdr).get();
        if(visited.count(p))
            return -2;
        visited.insert(p);
    }
}